

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool __thiscall mpt::slice::shift(slice *this,ssize_t len)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  
  if (len < 0) {
    uVar1 = this->_off;
    if (SBORROW8(uVar1,-len) != (long)(uVar1 + len) < 0) {
      return false;
    }
    uVar2 = this->_len;
  }
  else {
    uVar2 = this->_len;
    if ((long)uVar2 < len) {
      return false;
    }
    uVar1 = this->_off;
  }
  this->_len = uVar2 - len;
  this->_off = uVar1 + len;
  return true;
}

Assistant:

bool slice::shift(ssize_t len)
{
	if (len < 0) {
		if (-len > (ssize_t) _off) {
			return false;
		}
	}
	else if (len > (ssize_t) _len) {
		return false;
	}
	_len -= len;
	_off += len;
	return true;
}